

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_uninitialized_temporary
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id)

{
  anon_class_8_2_3ce7c506_for__M_pred __pred;
  Bitset *pBVar1;
  bool bVar2;
  uint32_t id;
  size_type sVar3;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar4;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar5;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar6;
  string local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [32];
  undefined1 local_e0 [64];
  spirv_cross local_a0 [48];
  string local_70 [8];
  string initializer;
  ID local_4c;
  Bitset *local_48;
  Bitset *flags;
  SPIRType *type;
  char local_30;
  uint32_t local_28;
  uint32_t uStack_24;
  SPIRBlock *local_20;
  SPIRBlock *header;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  header._0_4_ = result_id;
  header._4_4_ = result_type;
  _result_id_local = this;
  if ((((this->block_temporary_hoisting & 1U) == 0) &&
      (this->current_continue_block != (SPIRBlock *)0x0)) &&
     (sVar3 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(&(this->super_Compiler).hoisted_temporaries,(key_type *)&header), sVar3 == 0))
  {
    id = TypedID::operator_cast_to_unsigned_int
                   ((TypedID *)&this->current_continue_block->loop_dominator);
    local_20 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,id);
    ppVar4 = ::std::
             begin<spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>>
                       (&local_20->declare_temporary);
    ppVar5 = ::std::
             end<spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>>
                       (&local_20->declare_temporary);
    local_28 = header._4_4_;
    uStack_24 = (uint32_t)header;
    __pred.result_id = (uint32_t)header;
    __pred.result_type = header._4_4_;
    ppVar4 = ::std::
             find_if<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,spirv_cross::CompilerGLSL::emit_uninitialized_temporary(unsigned_int,unsigned_int)::__0>
                       (ppVar4,ppVar5,__pred);
    ppVar5 = ::std::
             end<spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>>
                       (&local_20->declare_temporary);
    if (ppVar4 == ppVar5) {
      SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>
      ::emplace_back<unsigned_int&,unsigned_int&>
                ((SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>
                  *)&local_20->declare_temporary,(uint *)((long)&header + 4),(uint *)&header);
      pVar6 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(&(this->super_Compiler).hoisted_temporaries,(value_type *)&header);
      type = (SPIRType *)pVar6.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_30 = pVar6.second;
      Compiler::force_recompile(&this->super_Compiler);
    }
  }
  else {
    sVar3 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&(this->super_Compiler).hoisted_temporaries,(key_type *)&header);
    if (sVar3 == 0) {
      flags = (Bitset *)Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,header._4_4_);
      TypedID<(spirv_cross::Types)0>::TypedID(&local_4c,(uint32_t)header);
      local_48 = Compiler::get_decoration_bitset(&this->super_Compiler,local_4c);
      add_local_variable_name(this,(uint32_t)header);
      ::std::__cxx11::string::string(local_70);
      if ((((this->options).force_zero_initialized_variables & 1U) != 0) &&
         (bVar2 = type_can_zero_initialize(this,(SPIRType *)flags), bVar2)) {
        (*(this->super_Compiler)._vptr_Compiler[0x37])(local_e0 + 0x20,this,(ulong)header._4_4_);
        join<char_const(&)[4],std::__cxx11::string>
                  (local_a0,(char (*) [4])0x5cb349,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_e0 + 0x20));
        ::std::__cxx11::string::operator=(local_70,(string *)local_a0);
        ::std::__cxx11::string::~string((string *)local_a0);
        ::std::__cxx11::string::~string((string *)(local_e0 + 0x20));
      }
      flags_to_qualifiers_glsl_abi_cxx11_((CompilerGLSL *)local_e0,(SPIRType *)this,flags);
      pBVar1 = flags;
      (*(this->super_Compiler)._vptr_Compiler[6])(local_120,this,(ulong)(uint32_t)header,1);
      (*(this->super_Compiler)._vptr_Compiler[0x1b])(local_100,this,pBVar1,local_120,0);
      statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 (char (*) [2])0x5b3b6f);
      ::std::__cxx11::string::~string((string *)local_100);
      ::std::__cxx11::string::~string(local_120);
      ::std::__cxx11::string::~string((string *)local_e0);
      ::std::__cxx11::string::~string(local_70);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::emit_uninitialized_temporary(uint32_t result_type, uint32_t result_id)
{
	// If we're declaring temporaries inside continue blocks,
	// we must declare the temporary in the loop header so that the continue block can avoid declaring new variables.
	if (!block_temporary_hoisting && current_continue_block && !hoisted_temporaries.count(result_id))
	{
		auto &header = get<SPIRBlock>(current_continue_block->loop_dominator);
		if (find_if(begin(header.declare_temporary), end(header.declare_temporary),
		            [result_type, result_id](const pair<uint32_t, uint32_t> &tmp) {
			            return tmp.first == result_type && tmp.second == result_id;
		            }) == end(header.declare_temporary))
		{
			header.declare_temporary.emplace_back(result_type, result_id);
			hoisted_temporaries.insert(result_id);
			force_recompile();
		}
	}
	else if (hoisted_temporaries.count(result_id) == 0)
	{
		auto &type = get<SPIRType>(result_type);
		auto &flags = get_decoration_bitset(result_id);

		// The result_id has not been made into an expression yet, so use flags interface.
		add_local_variable_name(result_id);

		string initializer;
		if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			initializer = join(" = ", to_zero_initialized_expression(result_type));

		statement(flags_to_qualifiers_glsl(type, flags), variable_decl(type, to_name(result_id)), initializer, ";");
	}
}